

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsHasException(bool *hasException)

{
  ScriptContext *pSVar1;
  Recycler *this;
  ThreadContext *this_00;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  JsrtContext *pJVar5;
  undefined4 *puVar6;
  size_t sVar7;
  RecyclableData *pRVar8;
  
  if (hasException == (bool *)0x0) {
    JVar4 = JsErrorNullArgument;
  }
  else {
    *hasException = false;
    pJVar5 = JsrtContext::GetCurrent();
    if (pJVar5 == (JsrtContext *)0x0) {
      JVar4 = JsErrorNoCurrentContext;
    }
    else {
      pSVar1 = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      if (pSVar1 == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                           ,0xc3e,"(scriptContext != nullptr)","scriptContext != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      this = pSVar1->recycler;
      this_00 = pSVar1->threadContext;
      if (this != (Recycler *)0x0) {
        if (this->objectBeforeCollectCallbackState != ObjectBeforeCollectCallback_None) {
          return JsErrorInObjectBeforeCollectCallback;
        }
        bVar3 = Memory::Recycler::IsHeapEnumInProgress(this);
        if (bVar3) {
          return JsErrorHeapEnumInProgress;
        }
      }
      JVar4 = JsErrorInThreadServiceCallback;
      if ((this_00->threadService).isInCallback == false) {
        sVar7 = ThreadContext::GetStackLimitForCurrentThread(this_00);
        JVar4 = JsErrorInDisabledState;
        if (sVar7 != 0x7fffffffffffffff) {
          pRVar8 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                             (&pSVar1->threadContext->recyclableData);
          *hasException = (pRVar8->exceptionObject).ptr != (JavascriptExceptionObject *)0x0;
          JVar4 = JsNoError;
        }
      }
    }
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsHasException(_Out_ bool *hasException)
{
    PARAM_NOT_NULL(hasException);
    *hasException = false;

    JsrtContext *currentContext = JsrtContext::GetCurrent();

    if (currentContext == nullptr)
    {
        return JsErrorNoCurrentContext;
    }

    Js::ScriptContext *scriptContext = currentContext->GetScriptContext();
    Assert(scriptContext != nullptr);
    Recycler *recycler = scriptContext->GetRecycler();
    ThreadContext *threadContext = scriptContext->GetThreadContext();

#ifndef JSRT_VERIFY_RUNTIME_STATE
    if (recycler && recycler->IsInObjectBeforeCollectCallback())
    {
        return JsErrorInObjectBeforeCollectCallback;
    }
#endif

    if (recycler && recycler->IsHeapEnumInProgress())
    {
        return JsErrorHeapEnumInProgress;
    }
    else if (threadContext->IsInThreadServiceCallback())
    {
        return JsErrorInThreadServiceCallback;
    }

    if (threadContext->IsExecutionDisabled())
    {
        return JsErrorInDisabledState;
    }

    *hasException = scriptContext->HasRecordedException();

    return JsNoError;
}